

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O2

int lws_add_http2_header_by_name(lws *wsi,uchar *name,uchar *value,int length,uchar **p,uchar *end)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ulong __n;
  long lVar8;
  
  iVar4 = 0;
  _lws_log(0x40,"%s: %p  %s:%s (len %d)\n","lws_add_http2_header_by_name",*p,name,value,length);
  sVar7 = strlen((char *)name);
  iVar5 = (int)sVar7;
  if (iVar5 != 0) {
    iVar4 = iVar5 - (uint)(name[iVar5 + -1] == ':');
  }
  if (((wsi->field_0x2dc & 2) != 0) &&
     (iVar5 = strncmp((char *)name,"transfer-encoding",(long)iVar4), iVar5 == 0)) {
    _lws_log(0x40,"rejecting %s\n",name);
    return 0;
  }
  puVar1 = *p;
  iVar5 = 1;
  if ((long)(iVar4 + length + 8) <= (long)end - (long)puVar1) {
    *p = puVar1 + 1;
    *puVar1 = '\0';
    uVar3 = '\x7f';
    if ((ulong)(long)iVar4 < 0x7f) {
      uVar3 = (uchar)iVar4;
    }
    puVar1 = *p;
    *p = puVar1 + 1;
    *puVar1 = uVar3;
    iVar6 = lws_h2_num(iVar4,(unsigned_long)p,(uchar **)end,puVar1);
    if (iVar6 == 0) {
      for (lVar8 = 0; iVar4 != (int)lVar8; lVar8 = lVar8 + 1) {
        iVar6 = tolower((uint)name[lVar8]);
        puVar1 = *p;
        *p = puVar1 + 1;
        *puVar1 = (uchar)iVar6;
      }
      __n = (ulong)length;
      uVar3 = '\x7f';
      if (__n < 0x7f) {
        uVar3 = (uchar)length;
      }
      puVar2 = *p;
      puVar1 = puVar2 + 1;
      *p = puVar1;
      *puVar2 = uVar3;
      iVar4 = lws_h2_num(length,(unsigned_long)p,(uchar **)end,puVar1);
      if (iVar4 == 0) {
        memcpy(*p,value,__n);
        *p = *p + __n;
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int lws_add_http2_header_by_name(struct lws *wsi, const unsigned char *name,
				 const unsigned char *value, int length,
				 unsigned char **p, unsigned char *end)
{
	int len;

	lwsl_header("%s: %p  %s:%s (len %d)\n", __func__, *p, name, value,
					length);

	len = (int)strlen((char *)name);
	if (len)
		if (name[len - 1] == ':')
			len--;

	if (wsi->mux_substream && !strncmp((const char *)name,
					     "transfer-encoding", len)) {
		lwsl_header("rejecting %s\n", name);

		return 0;
	}

	if (end - *p < len + length + 8)
		return 1;

	*((*p)++) = 0; /* literal hdr, literal name,  */

	*((*p)++) = 0 | lws_h2_num_start(7, len); /* non-HUF */
	if (lws_h2_num(7, len, p, end))
		return 1;

	/* upper-case header names are verboten in h2, but OK on h1, so
	 * they're not illegal per se.  Silently convert them for h2... */

	while(len--)
		*((*p)++) = tolower((int)*name++);

	*((*p)++) = 0 | lws_h2_num_start(7, length); /* non-HUF */
	if (lws_h2_num(7, length, p, end))
		return 1;

	memcpy(*p, value, length);
	*p += length;

	return 0;
}